

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::ReverseHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,ScriptContext *scriptContext)

{
  ScriptContext *addr;
  Type *addr_00;
  undefined8 uVar1;
  Type TVar2;
  InterruptPoller *pIVar3;
  int *piVar4;
  SparseArraySegmentBase *pSVar5;
  code *pcVar6;
  SparseArraySegmentBase *this;
  SparseArraySegmentBase *pSVar7;
  bool bVar8;
  DynamicObjectFlags DVar9;
  int iVar10;
  BOOL BVar11;
  uint32 startIndex;
  int iVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined7 extraout_var;
  ulong uVar14;
  uint uVar15;
  char16_t *varName;
  ulong uVar16;
  RecyclableObject *pRVar17;
  uint64 index;
  uint uVar18;
  ulong uVar19;
  uint32 limitIndex;
  uint64 index_00;
  bool bVar20;
  undefined1 local_a0 [8];
  AutoDisableInterrupt failFastOnError;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  Var lowerValue;
  Var upperValue;
  Recycler *local_48;
  ulong local_40;
  ScriptContext *local_38;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  local_38 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,pArr);
  jsReentLock.m_savedNoJsReentrancy = false;
  jsReentLock._25_7_ = 0;
  lowerValue = (Var)0x0;
  varName = L"[TypedArray].prototype.reverse";
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    varName = L"Array.prototype.reverse";
  }
  failFastOnError._8_8_ = pArr;
  if ((pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) &&
     (bVar8 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar8)) {
    typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
  }
  local_40 = length >> 1;
  limitIndex = (uint32)length;
  pRVar17 = obj;
  if ((failFastOnError._8_8_ == 0) ||
     (bVar8 = HasAnyES5ArrayInPrototypeChain((JavascriptArray *)failFastOnError._8_8_,false), bVar8)
     ) {
    if (length >> 0x20 == 0 && typedArrayBase != (TypedArrayBase *)0x0) {
      if ((typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length == length) {
        if (1 < length) {
          uVar19 = 0;
          do {
            limitIndex = limitIndex - 1;
            jsReentLock._24_4_ =
                 (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,uVar19);
            jsReentLock._28_4_ = extraout_var_00;
            iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                               (typedArrayBase,(ulong)limitIndex);
            lowerValue = (Var)CONCAT44(extraout_var_01,iVar10);
            (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x24])(typedArrayBase,uVar19);
            (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x24])(typedArrayBase,(ulong)limitIndex);
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                               (typedArrayBase,uVar19,lowerValue);
            if ((iVar10 == 0) ||
               (iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                           super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                                   (typedArrayBase,(ulong)limitIndex,jsReentLock._24_8_),
               iVar10 == 0)) {
              JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,varName);
            }
            JsReentLock::MutateArrayObject((JsReentLock *)local_80);
            *(bool *)((long)local_80 + 0x108) = true;
            uVar18 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar18;
          } while ((uint)local_40 != uVar18);
        }
      }
      else {
        if (length >> 0x21 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x16c4,"(middle <= 0xffffffff)","middle <= UINT_MAX");
          if (!bVar8) goto LAB_00b9ce04;
          *puVar13 = 0;
        }
        if (1 < length) {
          uVar18 = 1;
          if (1 < (uint)local_40) {
            uVar18 = (uint)local_40;
          }
          local_40 = CONCAT44(local_40._4_4_,uVar18);
          uVar19 = 0;
          do {
            limitIndex = limitIndex - 1;
            jsReentLock._24_4_ =
                 (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,uVar19);
            jsReentLock._28_4_ = extraout_var_02;
            iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                               (typedArrayBase,(ulong)limitIndex);
            lowerValue = (Var)CONCAT44(extraout_var_03,iVar10);
            iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x24])
                               (typedArrayBase,uVar19);
            iVar12 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x24])
                               (typedArrayBase,(ulong)limitIndex);
            if (iVar10 == 1) {
              if (iVar12 == 1) {
                *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                           super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                                   (typedArrayBase,uVar19,lowerValue);
                if ((iVar10 == 0) ||
                   (iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                               super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                                       (typedArrayBase,(ulong)limitIndex,jsReentLock._24_8_),
                   iVar10 == 0)) goto LAB_00b9cde8;
                JsReentLock::MutateArrayObject((JsReentLock *)local_80);
              }
              else {
                iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                           super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2a])
                                   (typedArrayBase,uVar19,0x400);
                if (iVar10 == 0) {
LAB_00b9cde8:
                  JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,varName);
                }
                *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                           super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                                   (typedArrayBase,(ulong)limitIndex,jsReentLock._24_8_);
                if (iVar10 == 0) goto LAB_00b9cde8;
                JsReentLock::MutateArrayObject((JsReentLock *)local_80);
              }
              *(bool *)((long)local_80 + 0x108) = true;
            }
            else if (iVar12 == 1) {
              *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                         super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                                 (typedArrayBase,uVar19,lowerValue);
              if (iVar10 == 0) goto LAB_00b9cde8;
              JsReentLock::MutateArrayObject((JsReentLock *)local_80);
              *(bool *)((long)local_80 + 0x108) = true;
              iVar10 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                         super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2a])
                                 (typedArrayBase,(ulong)limitIndex,0x400);
              if (iVar10 == 0) goto LAB_00b9cde8;
            }
            uVar18 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar18;
          } while ((uint)local_40 != uVar18);
        }
      }
    }
    else if (1 < length) {
      index_00 = length - 1;
      index = 0;
      do {
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar11 = JavascriptOperators::HasItem(obj,index);
        if (BVar11 == 0) {
          bVar8 = false;
        }
        else {
          BVar11 = JavascriptOperators::GetItem
                             (obj,index,(Var *)&jsReentLock.m_savedNoJsReentrancy,local_38);
          bVar8 = BVar11 != 0;
        }
        BVar11 = JavascriptOperators::HasItem(obj,index_00);
        if (BVar11 == 0) {
          bVar20 = false;
        }
        else {
          BVar11 = JavascriptOperators::GetItem(obj,index_00,&lowerValue,local_38);
          bVar20 = BVar11 != 0;
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if (bVar8) {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (bVar20) {
            BVar11 = JavascriptOperators::SetItem
                               (obj,obj,index,lowerValue,local_38,
                                PropertyOperation_ThrowIfNotExtensible);
            if ((BVar11 == 0) ||
               (BVar11 = JavascriptOperators::SetItem
                                   (obj,obj,index_00,(Var)jsReentLock._24_8_,local_38,
                                    PropertyOperation_ThrowIfNotExtensible), BVar11 == 0)) {
LAB_00b9cdc4:
              JavascriptError::ThrowTypeError(local_38,-0x7ff5fe43,varName);
            }
            JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          }
          else {
            BVar11 = JavascriptOperators::DeleteItem
                               (obj,index,PropertyOperation_ThrowOnDeleteIfNotConfig);
            if ((BVar11 == 0) ||
               (BVar11 = JavascriptOperators::SetItem
                                   (obj,obj,index_00,(Var)jsReentLock._24_8_,local_38,
                                    PropertyOperation_ThrowIfNotExtensible), BVar11 == 0))
            goto LAB_00b9cdc4;
            JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          }
LAB_00b9c81e:
          *(bool *)((long)local_80 + 0x108) = true;
        }
        else if (bVar20) {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BVar11 = JavascriptOperators::SetItem
                             (obj,obj,index,lowerValue,local_38,
                              PropertyOperation_ThrowIfNotExtensible);
          if ((BVar11 == 0) ||
             (BVar11 = JavascriptOperators::DeleteItem
                                 (obj,index_00,PropertyOperation_ThrowOnDeleteIfNotConfig),
             BVar11 == 0)) goto LAB_00b9cdc4;
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          goto LAB_00b9c81e;
        }
        index = index + 1;
        index_00 = index_00 - 1;
      } while (local_40 != index);
    }
  }
  else {
    if (length >> 0x20 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1614,"(length <= JavascriptArray::MaxArrayLength)",
                                  "length <= JavascriptArray::MaxArrayLength");
      if (!bVar8) {
LAB_00b9ce04:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar13 = 0;
    }
    uVar1 = failFastOnError._8_8_;
    pRVar17 = (RecyclableObject *)failFastOnError._8_8_;
    if (1 < length) {
      local_48 = local_38->recycler;
      bVar8 = IsFillFromPrototypes((JavascriptArray *)failFastOnError._8_8_);
      if (bVar8) {
        startIndex = 0;
        if ((length & 1) != 0) {
          FillFromPrototypes((JavascriptArray *)uVar1,0,(uint32)local_40);
          startIndex = (int)local_40 + 1;
        }
        FillFromPrototypes((JavascriptArray *)uVar1,startIndex,limitIndex);
      }
      if (*(uint *)(uVar1 + 0x20) != length) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      DVar9 = DynamicObject::GetArrayFlags((DynamicObject *)uVar1);
      if ((((DVar9 & HasNoMissingValues) != None) && (*(long *)(uVar1 + 0x28) != 0)) &&
         (*(long *)(*(long *)(uVar1 + 0x28) + 0x10) != 0)) {
        DVar9 = DynamicObject::GetArrayFlags((DynamicObject *)uVar1);
        DynamicObject::SetArrayFlags((DynamicObject *)uVar1,DVar9 & ~HasNoMissingValues);
      }
      uVar18 = *(uint *)(uVar1 + 0x20);
      ClearSegmentMap((JavascriptArray *)uVar1);
      bVar8 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>((JavascriptArray *)uVar1);
      local_40 = CONCAT71(local_40._1_7_,bVar8);
      if (bVar8) {
        upperValue._4_4_ = 0;
      }
      else {
        bVar8 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>((JavascriptArray *)uVar1);
        upperValue._4_4_ = (undefined4)CONCAT71(extraout_var,bVar8);
      }
      local_a0 = (undefined1  [8])local_38->threadContext;
      failFastOnError.m_threadContext._0_2_ = 0;
      failFastOnError.m_threadContext._2_1_ = 1;
      pIVar3 = ((ThreadContext *)local_a0)->interruptPoller;
      if (pIVar3 != (InterruptPoller *)0x0) {
        failFastOnError.m_threadContext._0_2_ = (ushort)pIVar3->isDisabled << 8;
        pIVar3->isDisabled = true;
      }
      addr = (ScriptContext *)(uVar1 + 0x28);
      piVar4 = *(int **)(uVar1 + 0x28);
      if ((piVar4 != (int *)0x0) &&
         ((*(long *)(piVar4 + 4) != 0 || ((uint)(piVar4[1] + *piVar4) < uVar18)))) {
        if ((char)local_40 == '\0') {
          if (upperValue._4_1_ == '\0') {
            CopyHeadIfInlinedHeadSegment<void*>((JavascriptArray *)uVar1,local_48);
          }
          else {
            CopyHeadIfInlinedHeadSegment<double>((JavascriptArray *)uVar1,local_48);
            if (*(long *)(*(long *)addr + 0x10) != 0) {
              ReallocateNonLeafLastSegmentIfLeaf<double>((JavascriptArray *)uVar1,local_48);
            }
          }
        }
        else {
          CopyHeadIfInlinedHeadSegment<int>((JavascriptArray *)uVar1,local_48);
          if (*(long *)(*(long *)addr + 0x10) != 0) {
            ReallocateNonLeafLastSegmentIfLeaf<int>((JavascriptArray *)uVar1,local_48);
          }
        }
      }
      pSVar5 = *(SparseArraySegmentBase **)addr;
      pSVar7 = (SparseArraySegmentBase *)0x0;
      while (this = pSVar5, local_38 = addr, this != (SparseArraySegmentBase *)0x0) {
        pSVar5 = (this->next).ptr;
        TVar2 = this->length;
        if (TVar2 != 0) {
          if ((char)local_40 == '\0') {
            if (upperValue._4_1_ == '\0') {
              SparseArraySegment<void_*>::ReverseSegment
                        ((SparseArraySegment<void_*> *)this,local_48);
            }
            else if ((TVar2 != 1) && (TVar2 - 1 != 0)) {
              uVar16 = 0;
              uVar19 = (ulong)(TVar2 - 1);
              do {
                uVar14 = uVar19 - 1;
                uVar1 = *(undefined8 *)(&this[1].left + uVar16 * 2);
                *(undefined8 *)(&this[1].left + uVar16 * 2) =
                     *(undefined8 *)(&this[1].left + uVar19 * 2);
                *(undefined8 *)(&this[1].left + uVar19 * 2) = uVar1;
                uVar16 = uVar16 + 1;
                uVar19 = uVar14;
              } while (uVar16 < (uVar14 & 0xffffffff));
            }
          }
          else if ((TVar2 != 1) && (TVar2 - 1 != 0)) {
            uVar16 = 0;
            uVar19 = (ulong)(TVar2 - 1);
            do {
              uVar14 = uVar19 - 1;
              TVar2 = (&this[1].left)[uVar16];
              (&this[1].left)[uVar16] = (&this[1].left)[uVar19];
              (&this[1].left)[uVar19] = TVar2;
              uVar16 = uVar16 + 1;
              uVar19 = uVar14;
            } while (uVar16 < (uVar14 & 0xffffffff));
          }
          uVar15 = this->length + this->left;
          if (uVar18 < uVar15) {
            Throw::FatalInternalError(-0x7fffbffb);
          }
          addr_00 = &this->next;
          this->left = uVar18 - uVar15;
          Memory::Recycler::WBSetBit((char *)addr_00);
          addr_00->ptr = pSVar7;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
          SparseArraySegmentBase::EnsureSizeInBound(this);
          addr = local_38;
          pSVar7 = this;
        }
      }
      Memory::Recycler::WBSetBit((char *)addr);
      uVar1 = failFastOnError._8_8_;
      *(SparseArraySegmentBase **)addr = pSVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      if ((char)local_40 == '\0') {
        if (upperValue._4_1_ == '\0') {
          EnsureHeadStartsFromZero<void*>((JavascriptArray *)uVar1,local_48);
        }
        else {
          EnsureHeadStartsFromZero<double>((JavascriptArray *)uVar1,local_48);
        }
      }
      else {
        EnsureHeadStartsFromZero<int>((JavascriptArray *)uVar1,local_48);
      }
      SetLastUsedSegment((JavascriptArray *)uVar1,*(SparseArraySegmentBase **)(uVar1 + 0x28));
      ClearSegmentMap((JavascriptArray *)uVar1);
      (**(code **)(*(long *)uVar1 + 0x3a0))(uVar1);
      failFastOnError.m_threadContext._0_1_ = 1;
      AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_a0);
      pRVar17 = obj;
    }
  }
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pRVar17;
}

Assistant:

Var JavascriptArray::ReverseHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        T middle = length / 2;
        Var lowerValue = nullptr, upperValue = nullptr;
        T lowerExists, upperExists;
        const char16* methodName;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;

        if (isTypedArrayEntryPoint)
        {
            methodName = _u("[TypedArray].prototype.reverse");
        }
        else
        {
            methodName = _u("Array.prototype.reverse");
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, methodName);

        bool useNoSideEffectReverse = pArr != nullptr && !HasAnyES5ArrayInPrototypeChain(pArr);

        if (useNoSideEffectReverse)
        {
            Assert(length <= JavascriptArray::MaxArrayLength);
            Recycler * recycler = scriptContext->GetRecycler();

            if (length <= 1)
            {
                return pArr;
            }

            if (pArr->IsFillFromPrototypes())
            {
                // For odd-length arrays, the middle element is unchanged,
                // so we cannot fill it from the prototypes.
                if (length % 2 == 0)
                {
                    pArr->FillFromPrototypes(0, (uint32)length);
                }
                else
                {
                    middle = length / 2;
                    pArr->FillFromPrototypes(0, (uint32)middle);
                    pArr->FillFromPrototypes(1 + (uint32)middle, (uint32)length);
                }
            }

            // As we have already established that the FillFromPrototype should not change the bound of the array.
            if (length != (T)pArr->length)
            {
                Js::Throw::FatalInternalError();
            }

            if (pArr->HasNoMissingValues() && pArr->head && pArr->head->next)
            {
                // This function currently does not track missing values in the head segment if there are multiple segments
                pArr->SetHasNoMissingValues(false);
            }

            // Above FillFromPrototypes call can change the length of the array. Our segment calculation below will
            // not work with the stale length. Update the length.
            // Note : since we are reversing the whole segment below - the functionality is not spec compliant already.
            length = pArr->length;

            SparseArraySegmentBase *prevSeg = nullptr;
            SparseArraySegmentBase *nextSeg = nullptr;

            bool isIntArray = false;
            bool isFloatArray = false;

            pArr->ClearSegmentMap(); // Just dump the segment map on reverse

            if (VarIs<JavascriptNativeIntArray>(pArr))
            {
                isIntArray = true;
            }
            else if (VarIs<JavascriptNativeFloatArray>(pArr))
            {
                isFloatArray = true;
            }

            // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
            AutoDisableInterrupt failFastOnError(scriptContext->GetThreadContext());

            // During the loop below we are going to reverse the segments list. The head segment will become the last segment.
            // We have to verify that the current head segment is not the inilined segement, otherwise due to shuffling below (of EnsureHeadStartsFromZero call below), the inlined segment will no longer
            // be the head and that can create issue down the line. Create new segment if it is an inilined segment.
            if (pArr->head && (pArr->head->next || (pArr->head->left + pArr->head->length) < length))
            {
                if (isIntArray)
                {
                    CopyHeadIfInlinedHeadSegment<int32>(pArr, recycler);
                    if (pArr->head->next)
                    {
                        ReallocateNonLeafLastSegmentIfLeaf<int32>(pArr, recycler);
                    }
                }
                else if (isFloatArray)
                {
                    CopyHeadIfInlinedHeadSegment<double>(pArr, recycler);
                    if (pArr->head->next)
                    {
                        ReallocateNonLeafLastSegmentIfLeaf<double>(pArr, recycler);
                    }
                }
                else
                {
                    CopyHeadIfInlinedHeadSegment<Var>(pArr, recycler);
                }
            }

            SparseArraySegmentBase* seg = pArr->head;

            while (seg)
            {
                nextSeg = seg->next;

                // If seg.length == 0, it is possible that (seg.left + seg.length == prev.left + prev.length),
                // resulting in 2 segments sharing the same "left".
                if (seg->length > 0)
                {
                    if (isIntArray)
                    {
                        ((SparseArraySegment<int32>*)seg)->ReverseSegment(recycler);
                    }
                    else if (isFloatArray)
                    {
                        ((SparseArraySegment<double>*)seg)->ReverseSegment(recycler);
                    }
                    else
                    {
                        ((SparseArraySegment<Var>*)seg)->ReverseSegment(recycler);
                    }

                    if (((uint32)length) < (seg->left + seg->length))
                    {
                        Js::Throw::FatalInternalError();
                    }
                    seg->left = ((uint32)length) - (seg->left + seg->length);

                    seg->next = prevSeg;
                    // Make sure size doesn't overlap with next segment.
                    // An easy fix is to just truncate the size...
                    seg->EnsureSizeInBound();

                    prevSeg = seg;
                }

                seg = nextSeg;
            }

            pArr->head = prevSeg;

            if (isIntArray)
            {
                pArr->EnsureHeadStartsFromZero<int32>(recycler);
            }
            else if (isFloatArray)
            {
                pArr->EnsureHeadStartsFromZero<double>(recycler);
            }
            else
            {
                pArr->EnsureHeadStartsFromZero<Var>(recycler);
            }

            pArr->InvalidateLastUsedSegment(); // lastUsedSegment might be 0-length and discarded above
            pArr->ClearSegmentMap();
#ifdef VALIDATE_ARRAY
            pArr->ValidateArray();
#endif

            failFastOnError.Completed();
        }
        else if (typedArrayBase && length <= JavascriptArray::MaxArrayLength)
        {
            if (typedArrayBase->GetLength() == length)
            {
                // If typedArrayBase->length == length then we know that the TypedArray will have all items < length
                // and we won't have to check that the elements exist or not.
                for (uint32 lower = 0; lower < (uint32)middle; lower++)
                {
                    uint32 upper = (uint32)length - lower - 1;

                    lowerValue = typedArrayBase->DirectGetItem(lower);
                    upperValue = typedArrayBase->DirectGetItem(upper);

                    // We still have to call HasItem even though we know the TypedArray has both lower and upper because
                    // there may be a proxy handler trapping HasProperty.
                    lowerExists = typedArrayBase->HasItem(lower);
                    upperExists = typedArrayBase->HasItem(upper);

                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)),
                        h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                }
            }
            else
            {
                Assert(middle <= UINT_MAX);
                for (uint32 lower = 0; lower < (uint32)middle; lower++)
                {
                    uint32 upper = (uint32)length - lower - 1;

                    lowerValue = typedArrayBase->DirectGetItem(lower);
                    upperValue = typedArrayBase->DirectGetItem(upper);

                    lowerExists = typedArrayBase->HasItem(lower);
                    upperExists = typedArrayBase->HasItem(upper);

                    if (lowerExists)
                    {
                        if (upperExists)
                        {
                            JS_REENTRANT(jsReentLock,
                                h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)),
                                h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                        }
                        else
                        {
                            // This will always fail for a TypedArray if lower < length
                            h.ThrowTypeErrorOnFailure(typedArrayBase->DeleteItem(lower, PropertyOperation_ThrowOnDeleteIfNotConfig));
                            JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                        }
                    }
                    else
                    {
                        if (upperExists)
                        {
                            JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)));
                            // This will always fail for a TypedArray if upper < length
                            h.ThrowTypeErrorOnFailure(typedArrayBase->DeleteItem(upper, PropertyOperation_ThrowOnDeleteIfNotConfig));
                        }
                    }
                }
            }
        }
        else
        {
            for (T lower = 0; lower < middle; lower++)
            {
                T upper = length - lower - 1;

                JS_REENTRANT(jsReentLock,
                    lowerExists = JavascriptOperators::HasItem(obj, lower) && JavascriptOperators::GetItem(obj, lower, &lowerValue, scriptContext),
                    upperExists = JavascriptOperators::HasItem(obj, upper) && JavascriptOperators::GetItem(obj, upper, &upperValue, scriptContext));

                if (lowerExists)
                {
                    if (upperExists)
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, lower, upperValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, upper, lowerValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(obj, lower, PropertyOperation_ThrowOnDeleteIfNotConfig)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, upper, lowerValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                    }
                }
                else
                {
                    if (upperExists)
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, lower, upperValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(obj, upper, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                    }
                }
            }
        }

        return obj;
    }